

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O0

ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
* __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
::operator=(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            *this,ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                  *rhs)

{
  int iVar1;
  int iVar2;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *in_RSI;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *in_RDI;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *unaff_retaddr;
  int i;
  Item *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_14;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *pCVar3;
  int newmax;
  
  if (in_RDI != in_RSI) {
    pCVar3 = in_RDI;
    iVar1 = size(in_RSI);
    newmax = (int)((ulong)pCVar3 >> 0x20);
    iVar2 = max(in_RDI);
    if (iVar2 < iVar1) {
      size(in_RSI);
      reMax(unaff_retaddr,newmax);
    }
    clear(in_RDI);
    local_14 = 0;
    while( true ) {
      iVar1 = size(in_RSI);
      if (iVar1 <= local_14) break;
      Item::operator=((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8);
      local_14 = local_14 + 1;
    }
    local_14 = 0;
    while( true ) {
      iVar1 = local_14;
      iVar2 = num(in_RSI);
      if (iVar2 <= iVar1) break;
      in_RDI->thekey[local_14] = in_RSI->thekey[local_14];
      local_14 = local_14 + 1;
    }
    if (in_RSI->firstfree == -1 - in_RSI->themax) {
      in_RDI->firstfree = -1 - in_RDI->themax;
    }
    else {
      in_RDI->firstfree = in_RSI->firstfree;
      local_14 = in_RSI->firstfree;
      while (in_RSI->theitem[-1 - local_14].info != -1 - in_RSI->themax) {
        local_14 = in_RSI->theitem[-1 - local_14].info;
      }
      in_RDI->theitem[-1 - local_14].info = -1 - in_RDI->themax;
    }
    in_RDI->thenum = in_RSI->thenum;
    in_RDI->thesize = in_RSI->thesize;
  }
  return in_RDI;
}

Assistant:

ClassSet < T >& operator=(const ClassSet < T >& rhs)
   {
      if(this != &rhs)
      {
         int i;

         if(rhs.size() > max())
            reMax(rhs.size());

         clear();

         for(i = 0; i < rhs.size(); ++i)
            theitem[i] = std::move(rhs.theitem[i]);

         for(i = 0; i < rhs.num(); ++i)
            thekey[i] = rhs.thekey[i];

         if(rhs.firstfree == -rhs.themax - 1)
            firstfree = -themax - 1;
         else
         {
            firstfree = rhs.firstfree;
            i = rhs.firstfree;

            while(rhs.theitem[ -i - 1].info != -rhs.themax - 1)
               i = rhs.theitem[ -i - 1].info;

            theitem[ -i - 1].info = -themax - 1;
         }

         thenum = rhs.thenum;
         thesize = rhs.thesize;

         assert(isConsistent());
      }

      return *this;
   }